

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.h
# Opt level: O2

void __thiscall SignatureData::SignatureData(SignatureData *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  uint160 *puVar3;
  base_blob<256U> *pbVar4;
  base_blob<160U> *pbVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this->complete = false;
  this->witness = false;
  (this->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header;
  (this->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&this->scriptSig,0,0xb8);
  (this->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->tr_builder).super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  p_Var1 = &(this->signatures)._M_t._M_impl.super__Rb_tree_header;
  (this->signatures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->signatures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->signatures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->signatures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->signatures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header;
  (this->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->taproot_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->taproot_script_sigs)._M_t._M_impl.super__Rb_tree_header;
  (this->taproot_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->taproot_key_path_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->taproot_key_path_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->taproot_key_path_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->taproot_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->taproot_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->taproot_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header;
  (this->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->tap_pubkeys)._M_t._M_impl.super__Rb_tree_header;
  (this->tap_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tap_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tap_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tap_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header;
  (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pbVar4 = &(this->missing_witness_script).super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  pbVar4 = &(this->missing_witness_script).super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  pbVar4 = &(this->missing_witness_script).super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[4] = '\0';
  (pbVar4->m_data)._M_elems[5] = '\0';
  (pbVar4->m_data)._M_elems[6] = '\0';
  (pbVar4->m_data)._M_elems[7] = '\0';
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  pbVar4 = &(this->missing_witness_script).super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  pbVar5 = &(this->missing_redeem_script).super_base_blob<160U>;
  (pbVar5->m_data)._M_elems[8] = '\0';
  (pbVar5->m_data)._M_elems[9] = '\0';
  (pbVar5->m_data)._M_elems[10] = '\0';
  (pbVar5->m_data)._M_elems[0xb] = '\0';
  (pbVar5->m_data)._M_elems[0xc] = '\0';
  (pbVar5->m_data)._M_elems[0xd] = '\0';
  (pbVar5->m_data)._M_elems[0xe] = '\0';
  (pbVar5->m_data)._M_elems[0xf] = '\0';
  *(undefined8 *)((this->missing_redeem_script).super_base_blob<160U>.m_data._M_elems + 0x10) = 0;
  (this->missing_sigs).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = &this->missing_redeem_script;
  (puVar3->super_base_blob<160U>).m_data._M_elems[0] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[1] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[2] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[3] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[4] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[5] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[6] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[7] = '\0';
  (this->missing_sigs).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->missing_sigs).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->missing_pubkeys).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->missing_pubkeys).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tap_pubkeys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->missing_pubkeys).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header;
  (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header;
  (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header;
  (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SignatureData() = default;